

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O0

REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp,REF_INT node)

{
  uint uVar1;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LIST ref_list;
  long lStack_80;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_LONG ref_private_status_reis_bi_2;
  REF_LONG ref_private_status_reis_ai_2;
  ulong uStack_68;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  long lStack_50;
  REF_STATUS ref_private_macro_code_rss;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_INT id;
  REF_INT i;
  REF_AGENTS ref_agents;
  REF_NODE ref_node;
  REF_MPI ref_mpi;
  REF_INTERP pRStack_18;
  REF_INT node_local;
  REF_INTERP ref_interp_local;
  
  ref_mpi._4_4_ = node;
  pRStack_18 = ref_interp;
  if (ref_interp == (REF_INTERP)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0x74f,
           "ref_interp_locate_node","ref_interp NULL");
    ref_interp_local._4_4_ = 2;
  }
  else {
    ref_node = (REF_NODE)ref_interp->ref_mpi;
    if (ref_interp->max < node) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
             0x752,"ref_interp_locate_node","more nodes added, should move only");
      ref_interp_local._4_4_ = 1;
    }
    else if ((ref_interp->cell[node] == -1) || (ref_node->max != ref_interp->part[node])) {
      ref_interp_local._4_4_ = 0;
    }
    else {
      ref_agents = (REF_AGENTS)ref_interp->to_grid->node;
      _id = ref_interp->ref_agents;
      ref_private_status_reis_bi = 0;
      lStack_50 = (long)_id->n;
      if (lStack_50 == 0) {
        ref_interp->agent_hired[node] = 1;
        ref_private_status_reis_ai_1._4_4_ =
             ref_agents_push(_id,node,ref_interp->part[node],ref_interp->cell[node],
                             ((REF_NODE)ref_agents)->real + node * 0xf,
                             (REF_INT *)&ref_private_status_reis_ai);
        if (ref_private_status_reis_ai_1._4_4_ == 0) {
          ref_private_status_reis_bi_1 = 1;
          uStack_68 = (ulong)_id->agent[(int)ref_private_status_reis_ai].mode;
          if (uStack_68 == 1) {
            ref_private_status_reis_ai_2._4_4_ =
                 ref_interp_walk_agent(pRStack_18,(int)ref_private_status_reis_ai);
            if (ref_private_status_reis_ai_2._4_4_ == 0) {
              if (_id->agent[(int)ref_private_status_reis_ai].mode == REF_AGENT_ENCLOSING) {
                pRStack_18->cell[ref_mpi._4_4_] = _id->agent[(int)ref_private_status_reis_ai].seed;
                pRStack_18->part[ref_mpi._4_4_] = _id->agent[(int)ref_private_status_reis_ai].part;
                for (ref_private_status_reis_ai._4_4_ = 0; ref_private_status_reis_ai._4_4_ < 4;
                    ref_private_status_reis_ai._4_4_ = ref_private_status_reis_ai._4_4_ + 1) {
                  pRStack_18->bary[ref_private_status_reis_ai._4_4_ + ref_mpi._4_4_ * 4] =
                       _id->agent[(int)ref_private_status_reis_ai].bary
                       [ref_private_status_reis_ai._4_4_];
                }
                pRStack_18->walk_steps =
                     _id->agent[(int)ref_private_status_reis_ai].step + 1 + pRStack_18->walk_steps;
                pRStack_18->n_walk = pRStack_18->n_walk + 1;
                ref_private_status_reis_bi_2 = (REF_LONG)ref_node->max;
                lStack_80 = (long)pRStack_18->part[ref_mpi._4_4_];
                if (ref_private_status_reis_bi_2 != lStack_80) {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x76b,"ref_interp_locate_node","expected local",
                         ref_private_status_reis_bi_2,lStack_80);
                  return 1;
                }
                if (pRStack_18->from_grid->twod == 0) {
                  if (((pRStack_18->cell[ref_mpi._4_4_] < 0) ||
                      (pRStack_18->from_tet->max <= pRStack_18->cell[ref_mpi._4_4_])) ||
                     (pRStack_18->from_tet->c2n
                      [pRStack_18->from_tet->size_per * pRStack_18->cell[ref_mpi._4_4_]] == -1)) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x773,"ref_interp_locate_node","expected a valid tet");
                    return 1;
                  }
                }
                else if (((pRStack_18->cell[ref_mpi._4_4_] < 0) ||
                         (pRStack_18->from_tri->max <= pRStack_18->cell[ref_mpi._4_4_])) ||
                        (pRStack_18->from_tri->c2n
                         [pRStack_18->from_tri->size_per * pRStack_18->cell[ref_mpi._4_4_]] == -1))
                {
                  printf("%s: %d: %s: %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                         ,0x76f,"ref_interp_locate_node","expected a valid tri");
                  return 1;
                }
              }
              else {
                pRStack_18->cell[ref_mpi._4_4_] = -1;
              }
              pRStack_18->agent_hired[ref_mpi._4_4_] = 0;
              ref_list._4_4_ = ref_agents_remove(_id,(int)ref_private_status_reis_ai);
              if (ref_list._4_4_ == 0) {
                if (((int)(ref_agents[2].agent)->mode < 2) &&
                   (pRStack_18->cell[ref_mpi._4_4_] == -1)) {
                  uVar1 = ref_list_create((REF_LIST *)&ref_private_macro_code_rss_4);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x781,"ref_interp_locate_node",(ulong)uVar1,"create list");
                    return uVar1;
                  }
                  uVar1 = ref_search_touching(pRStack_18->ref_search,_ref_private_macro_code_rss_4,
                                              (REF_DBL *)
                                              (&(ref_agents[1].ref_mpi)->n +
                                              (long)(ref_mpi._4_4_ * 0xf) * 2),
                                              pRStack_18->search_fuzz);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x785,"ref_interp_locate_node",(ulong)uVar1,"tch");
                    return uVar1;
                  }
                  if (0 < _ref_private_macro_code_rss_4->n) {
                    if (pRStack_18->from_grid->twod == 0) {
                      uVar1 = ref_interp_enclosing_tet_in_list
                                        (pRStack_18,_ref_private_macro_code_rss_4,
                                         (REF_DBL *)
                                         (&(ref_agents[1].ref_mpi)->n +
                                         (long)(ref_mpi._4_4_ * 0xf) * 2),
                                         pRStack_18->cell + ref_mpi._4_4_,
                                         pRStack_18->bary + (ref_mpi._4_4_ << 2));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x790,"ref_interp_locate_node",(ulong)uVar1,"best tet in list");
                        return uVar1;
                      }
                    }
                    else {
                      uVar1 = ref_interp_enclosing_tri_in_list
                                        (pRStack_18,_ref_private_macro_code_rss_4,
                                         (REF_DBL *)
                                         (&(ref_agents[1].ref_mpi)->n +
                                         (long)(ref_mpi._4_4_ * 0xf) * 2),
                                         pRStack_18->cell + ref_mpi._4_4_,
                                         pRStack_18->bary + (ref_mpi._4_4_ << 2));
                      if (uVar1 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                               ,0x78b,"ref_interp_locate_node",(ulong)uVar1,"best tri in list");
                        return uVar1;
                      }
                    }
                  }
                  uVar1 = ref_list_free(_ref_private_macro_code_rss_4);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                           ,0x793,"ref_interp_locate_node",(ulong)uVar1,"free list");
                    return uVar1;
                  }
                }
                if (pRStack_18->cell[ref_mpi._4_4_] == -1) {
                  ref_interp_local._4_4_ = 5;
                }
                else {
                  ref_interp_local._4_4_ = 0;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                       ,0x77b,"ref_interp_locate_node",(ulong)ref_list._4_4_,"no longer needed");
                ref_interp_local._4_4_ = ref_list._4_4_;
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x763,"ref_interp_locate_node",(ulong)ref_private_status_reis_ai_2._4_4_,
                     "walking");
              ref_interp_local._4_4_ = ref_private_status_reis_ai_2._4_4_;
            }
          }
          else {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                   ,0x762,"ref_interp_locate_node","should be walking",1,uStack_68);
            ref_interp_local._4_4_ = 1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
                 0x761,"ref_interp_locate_node",(ulong)ref_private_status_reis_ai_1._4_4_,"requeue")
          ;
          ref_interp_local._4_4_ = ref_private_status_reis_ai_1._4_4_;
        }
      }
      else {
        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0x75b,"ref_interp_locate_node","did not expect active agents",0,lStack_50);
        ref_interp_local._4_4_ = 1;
      }
    }
  }
  return ref_interp_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_interp_locate_node(REF_INTERP ref_interp, REF_INT node) {
  REF_MPI ref_mpi;
  REF_NODE ref_node;
  REF_AGENTS ref_agents;
  REF_INT i, id;
  RNS(ref_interp, "ref_interp NULL");
  ref_mpi = ref_interp_mpi(ref_interp);

  RAS(node <= ref_interp_max(ref_interp), "more nodes added, should move only");

  /* no starting guess, skip */
  if (REF_EMPTY == ref_interp->cell[node] ||
      ref_mpi_rank(ref_mpi) != ref_interp->part[node])
    return REF_SUCCESS;

  ref_node = ref_grid_node(ref_interp_to_grid(ref_interp));
  ref_agents = ref_interp->ref_agents;
  REIS(0, ref_agents_n(ref_agents), "did not expect active agents");

  ref_interp->agent_hired[node] = REF_TRUE;
  RSS(ref_agents_push(ref_agents, node, ref_interp->part[node],
                      ref_interp->cell[node], ref_node_xyz_ptr(ref_node, node),
                      &id),
      "requeue");
  REIS(REF_AGENT_WALKING, ref_agent_mode(ref_agents, id), "should be walking");
  RSS(ref_interp_walk_agent(ref_interp, id), "walking");
  if (REF_AGENT_ENCLOSING == ref_agent_mode(ref_agents, id)) {
    ref_interp->cell[node] = ref_agent_seed(ref_agents, id);
    ref_interp->part[node] = ref_agent_part(ref_agents, id);
    for (i = 0; i < 4; i++)
      ref_interp->bary[i + 4 * node] = ref_agent_bary(ref_agents, i, id);
    (ref_interp->walk_steps) += (ref_agent_step(ref_agents, id) + 1);
    (ref_interp->n_walk)++;
    REIS(ref_mpi_rank(ref_mpi), ref_interp->part[node], "expected local");
    if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
      RAS(ref_cell_valid(ref_interp_from_tri(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tri");
    } else {
      RAS(ref_cell_valid(ref_interp_from_tet(ref_interp),
                         ref_interp->cell[node]),
          "expected a valid tet");
    }
  } else {
    /* new seed or go exhaustive for REF_AGENT_AT_BOUNDARY */
    /* what for parallel REF_AGENT_HOP_PART */
    ref_interp->cell[node] = REF_EMPTY;
  }
  ref_interp->agent_hired[node] = REF_FALSE; /* dismissed */
  RSS(ref_agents_remove(ref_agents, id), "no longer needed");

  if (!ref_mpi_para(ref_node_mpi(ref_node)) &&
      REF_EMPTY == ref_interp->cell[node]) {
    REF_LIST ref_list;

    RSS(ref_list_create(&ref_list), "create list");
    RSS(ref_search_touching(ref_interp_search(ref_interp), ref_list,
                            ref_node_xyz_ptr(ref_node, node),
                            ref_interp_search_fuzz(ref_interp)),
        "tch");
    if (ref_list_n(ref_list) > 0) {
      if (ref_grid_twod(ref_interp_from_grid(ref_interp))) {
        RSS(ref_interp_enclosing_tri_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tri in list");
      } else {
        RSS(ref_interp_enclosing_tet_in_list(
                ref_interp, ref_list, ref_node_xyz_ptr(ref_node, node),
                &(ref_interp->cell[node]), &(ref_interp->bary[4 * node])),
            "best tet in list");
      }
    }
    RSS(ref_list_free(ref_list), "free list");
  }

  if (REF_EMPTY == ref_interp->cell[node]) {
    return REF_NOT_FOUND;
  }
  return REF_SUCCESS;
}